

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_int8.c
# Opt level: O0

rt_function_error_t exec_convolution_int8(rt_function_t *f)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  var_t *var;
  void *pvVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  var_t *var_00;
  var_t *var_01;
  var_t *var_02;
  var_t *var_03;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t input_shape;
  rt_list_t input_shape_00;
  uint local_110;
  nn_size_t local_10c;
  int b_pos_1 [2];
  int w_pos_1 [3];
  int i_pos_1 [3];
  int o_pos_1 [3];
  int b_pos [2];
  int w_pos [3];
  int i_pos [3];
  int o_pos [3];
  int8_t *b_data;
  int i;
  uint out_fp;
  uint b_fp;
  uint bias_size;
  uint output_size;
  var_t *a_var;
  var_t *b_var;
  var_t *w_var;
  var_t *in_var;
  var_t *out_var;
  nn_size_t b;
  nn_size_t g;
  nn_size_t im;
  nn_size_t om;
  nn_size_t batch_size;
  nn_size_t out_vars;
  nn_size_t in_vars;
  nn_size_t group;
  convolution_private_t *p;
  convolution_local_context_t *c;
  rt_function_t *f_local;
  
  puVar4 = (undefined8 *)f->local_context;
  var = (var_t *)*puVar4;
  uVar1 = *(uint *)(puVar4 + 8);
  uVar2 = var[1].shape.data[2];
  uVar3 = (var->shape).data[2];
  var_00 = var + 1;
  var_01 = var + 2;
  var_02 = var + 3;
  var_03 = var + 4;
  shape._4_4_ = 0;
  shape.size = (var->shape).size;
  shape.data = (var->shape).data;
  uVar8 = calc_shape_size(shape);
  shape_00._4_4_ = 0;
  shape_00.size = var[3].shape.size;
  shape_00.data = var[3].shape.data;
  uVar9 = calc_shape_size(shape_00);
  if (var[3].v != (rt_variable_t *)0x0) {
    bVar6 = (byte)var_02->v->field_0x10 >> 4;
    bVar7 = (byte)var->v->field_0x10 >> 4;
    if (bVar7 < bVar6) {
      pvVar5 = var_02->v->data;
      for (b_data._4_4_ = 0; b_data._4_4_ < uVar9; b_data._4_4_ = b_data._4_4_ + 1) {
        *(char *)((long)pvVar5 + (long)(int)b_data._4_4_) =
             (char)((int)*(char *)((long)pvVar5 + (long)(int)b_data._4_4_) /
                   (1 << (bVar6 - bVar7 & 0x1f)));
      }
    }
    else if (bVar6 < bVar7) {
      printf(
            "OUTPUT variable has less range bits than BIAS variable. Please make sure conv/b has same or less range bits than Output to avoid overflow.\n"
            );
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }
  memset(var->v->data,0,(ulong)uVar8);
  uVar8 = *var[1].shape.data;
  if (*(int *)&var[5].v == 2) {
    for (out_var._0_4_ = 0; (uint)out_var < uVar8; out_var._0_4_ = (uint)out_var + 1) {
      for (out_var._4_4_ = 0; out_var._4_4_ < uVar1; out_var._4_4_ = out_var._4_4_ + 1) {
        for (g = 0; g < uVar3; g = g + 1) {
          i_pos[1] = (uint)out_var;
          i_pos[2] = out_var._4_4_;
          var_setpos(var,i_pos + 1,3);
          for (b = 0; b < uVar2; b = b + 1) {
            w_pos[1] = (uint)out_var;
            w_pos[2] = out_var._4_4_;
            i_pos[0] = b;
            b_pos[0] = out_var._4_4_;
            b_pos[1] = g;
            w_pos[0] = b;
            var_setpos(var_00,w_pos + 1,3);
            var_setpos(var_01,b_pos,3);
            input_shape._4_4_ = 0;
            input_shape.size = var[5].shape.size;
            input_shape.data = var[5].shape.data;
            conv2d(var,var_00,var_01,input_shape,*(rt_list_t *)&var[5].set,var[5].stride,
                   *(rt_list_t *)&var[5].offset,var[6].shape,*(rt_list_t *)(puVar4 + 2),
                   *(rt_list_t *)(puVar4 + 4),*(rt_list_t *)(puVar4 + 6),*(int *)&var[5].v);
          }
          o_pos_1[1] = out_var._4_4_;
          o_pos_1[2] = g;
          if (var[4].v != (rt_variable_t *)0x0) {
            var_setpos(var_03,o_pos_1 + 1,2);
            mul_alpha(var,var_03);
          }
          if (var[3].v != (rt_variable_t *)0x0) {
            var_setpos(var_02,o_pos_1 + 1,2);
            add_bias(var,var_02);
          }
        }
      }
    }
  }
  else {
    for (out_var._0_4_ = 0; (uint)out_var < uVar8; out_var._0_4_ = (uint)out_var + 1) {
      for (out_var._4_4_ = 0; out_var._4_4_ < uVar1; out_var._4_4_ = out_var._4_4_ + 1) {
        for (g = 0; g < uVar3; g = g + 1) {
          i_pos_1[1] = (uint)out_var;
          i_pos_1[2] = out_var._4_4_;
          o_pos_1[0] = g;
          var_setpos(var,i_pos_1 + 1,3);
          for (b = 0; b < uVar2; b = b + 1) {
            w_pos_1[1] = (uint)out_var;
            w_pos_1[2] = out_var._4_4_;
            i_pos_1[0] = b;
            b_pos_1[0] = out_var._4_4_;
            b_pos_1[1] = g;
            w_pos_1[0] = b;
            var_setpos(var_00,w_pos_1 + 1,3);
            var_setpos(var_01,b_pos_1,3);
            input_shape_00._4_4_ = 0;
            input_shape_00.size = var[5].shape.size;
            input_shape_00.data = var[5].shape.data;
            convnd(var,var_00,var_01,input_shape_00,*(rt_list_t *)&var[5].set,var[5].stride,
                   *(rt_list_t *)&var[5].offset,var[6].shape,*(rt_list_t *)(puVar4 + 2),
                   *(rt_list_t *)(puVar4 + 4),*(rt_list_t *)(puVar4 + 6),*(int *)&var[5].v);
          }
          local_110 = out_var._4_4_;
          local_10c = g;
          if (var[4].v != (rt_variable_t *)0x0) {
            var_setpos(var_03,(int *)&local_110,2);
            mul_alpha(var,var_03);
          }
          if (var[3].v != (rt_variable_t *)0x0) {
            var_setpos(var_02,(int *)&local_110,2);
            add_bias(var,var_02);
          }
        }
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_convolution_int8(rt_function_t *f) {
  convolution_local_context_t *c =
      (convolution_local_context_t *)f->local_context;
  convolution_private_t *p = (convolution_private_t *)(c->data);

  nn_size_t group = c->group;
  nn_size_t in_vars = p->in_var.shape.data[I];
  nn_size_t out_vars = p->out_var.shape.data[I];
  nn_size_t batch_size;
  nn_size_t om, im, g, b;

  var_t *out_var = &p->out_var;
  var_t *in_var = &p->in_var;
  var_t *w_var = &p->w_var;
  var_t *b_var = &p->b_var;
  var_t *a_var = &p->a_var;

  const unsigned output_size = calc_shape_size(out_var->shape);
  const unsigned bias_size = calc_shape_size(b_var->shape);

  if (p->b_var.v) {
    unsigned int b_fp = b_var->v->fp_pos;
    unsigned int out_fp = out_var->v->fp_pos;

    // If bias has less range bits (=more precision bits) than output, rescale
    // bias.
    // Otherwise, output has too few range bits. Change format before starting
    // computations.
    if (b_fp > out_fp) {
      int i;
      int8_t *b_data = (int8_t *)(b_var->v->data);
      for (i = 0; i < bias_size; i++) {
        *(b_data + i) /= (1 << (b_fp - out_fp));
      }
    } else if (b_fp < out_fp) {
      printf(
          "OUTPUT variable has less range bits than BIAS variable. Please "
          "make sure conv/b has same or less range bits than Output to avoid "
          "overflow.\n");
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }

  memset(out_var->v->data, 0, sizeof(int8_t) * output_size);

  batch_size = p->in_var.shape.data[0];
  if (p->spatial_dims == 2) {
    for (b = 0; b < batch_size; ++b) {
      for (g = 0; g < group; ++g) {
        for (om = 0; om < out_vars; ++om) {
          int o_pos[] = {b, g, om};
          var_setpos(out_var, o_pos, _S(o_pos));
          for (im = 0; im < in_vars; ++im) {
            int i_pos[] = {b, g, im};
            int w_pos[] = {g, om, im};
            var_setpos(in_var, i_pos, _S(i_pos));
            var_setpos(w_var, w_pos, _S(w_pos));
            conv2d(out_var, in_var, w_var, p->input_shape, p->output_shape,
                   p->kernel_shape, p->in_position, p->out_position, c->pad,
                   c->stride, c->dilation, p->spatial_dims);
          }
          {
            int b_pos[] = {g, om};
            if (p->a_var.v) {
              var_setpos(a_var, b_pos, _S(b_pos));
              mul_alpha(out_var, a_var);
            }
            if (p->b_var.v) {
              var_setpos(b_var, b_pos, _S(b_pos));
              add_bias(out_var, b_var);
            }
          }
        }
      }
    }
  } else {
    for (b = 0; b < batch_size; ++b) {
      for (g = 0; g < group; ++g) {
        for (om = 0; om < out_vars; ++om) {
          int o_pos[] = {b, g, om};
          var_setpos(out_var, o_pos, _S(o_pos));
          for (im = 0; im < in_vars; ++im) {
            int i_pos[] = {b, g, im};
            int w_pos[] = {g, om, im};
            var_setpos(in_var, i_pos, _S(i_pos));
            var_setpos(w_var, w_pos, _S(w_pos));
            convnd(out_var, in_var, w_var, p->input_shape, p->output_shape,
                   p->kernel_shape, p->in_position, p->out_position, c->pad,
                   c->stride, c->dilation, p->spatial_dims);
          }
          {
            int b_pos[] = {g, om};
            if (p->a_var.v) {
              var_setpos(a_var, b_pos, _S(b_pos));
              mul_alpha(out_var, a_var);
            }
            if (p->b_var.v) {
              var_setpos(b_var, b_pos, _S(b_pos));
              add_bias(out_var, b_var);
            }
          }
        }
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}